

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::NonMaximumSuppression::ByteSizeLong(NonMaximumSuppression *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  string *psVar4;
  
  psVar4 = (string *)
           ((ulong)(this->confidenceinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + 2;
  }
  psVar4 = (string *)
           ((ulong)(this->coordinatesinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 2;
  }
  psVar4 = (string *)
           ((ulong)(this->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 2;
  }
  psVar4 = (string *)
           ((ulong)(this->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 2;
  }
  psVar4 = (string *)
           ((ulong)(this->confidenceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 2;
  }
  psVar4 = (string *)
           ((ulong)(this->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 2;
  }
  sVar3 = sVar2 + 10;
  if (this->iouthreshold_ == 0.0) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 10;
  if (this->confidencethreshold_ == 0.0) {
    sVar2 = sVar3;
  }
  if (this->_oneof_case_[0] == 1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::NonMaximumSuppression_PickTop>
                      ((this->SuppressionMethod_).picktop_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->_oneof_case_[1] == 0x65) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::Int64Vector>((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[1] != 100) goto LAB_00242303;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::StringVector>
                      ((this->ClassLabels_).stringclasslabels_);
  }
  sVar2 = sVar2 + sVar3 + 2;
LAB_00242303:
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t NonMaximumSuppression::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppression)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // string confidenceInputFeatureName = 200;
  if (!this->_internal_confidenceinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidenceinputfeaturename());
  }

  // string coordinatesInputFeatureName = 201;
  if (!this->_internal_coordinatesinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_coordinatesinputfeaturename());
  }

  // string iouThresholdInputFeatureName = 202;
  if (!this->_internal_iouthresholdinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_iouthresholdinputfeaturename());
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (!this->_internal_confidencethresholdinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidencethresholdinputfeaturename());
  }

  // string confidenceOutputFeatureName = 210;
  if (!this->_internal_confidenceoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidenceoutputfeaturename());
  }

  // string coordinatesOutputFeatureName = 211;
  if (!this->_internal_coordinatesoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_coordinatesoutputfeaturename());
  }

  // double iouThreshold = 110;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_iouthreshold = this->_internal_iouthreshold();
  uint64_t raw_iouthreshold;
  memcpy(&raw_iouthreshold, &tmp_iouthreshold, sizeof(tmp_iouthreshold));
  if (raw_iouthreshold != 0) {
    total_size += 2 + 8;
  }

  // double confidenceThreshold = 111;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_confidencethreshold = this->_internal_confidencethreshold();
  uint64_t raw_confidencethreshold;
  memcpy(&raw_confidencethreshold, &tmp_confidencethreshold, sizeof(tmp_confidencethreshold));
  if (raw_confidencethreshold != 0) {
    total_size += 2 + 8;
  }

  switch (SuppressionMethod_case()) {
    // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
    case kPickTop: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *SuppressionMethod_.picktop_);
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}